

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

void upb_inttable_clear(upb_inttable *t)

{
  uint uVar1;
  uint8_t *__s;
  uint32_t uVar2;
  upb_value *__s_00;
  size_t sVar3;
  size_t bytes;
  size_t array_bytes;
  upb_inttable *t_local;
  
  uVar1 = t->array_size;
  t->array_count = 0;
  __s_00 = mutable_array(t);
  memset(__s_00,0xff,(ulong)uVar1 << 3);
  __s = t->presence_mask;
  uVar2 = presence_mask_arr_size(t->array_size);
  memset(__s,0,(ulong)uVar2);
  sVar3 = upb_table_size(&t->t);
  (t->t).count = 0;
  memset((t->t).entries,0,sVar3 * 0x18);
  return;
}

Assistant:

void upb_inttable_clear(upb_inttable* t) {
  // Clear the array part.
  size_t array_bytes = t->array_size * sizeof(upb_value);
  t->array_count = 0;
  // Clear the array by setting all bits to 1, as UINT64_MAX is the sentinel
  // value for an empty array.
  memset(mutable_array(t), 0xff, array_bytes);
  // Clear the presence mask array.
  memset((uint8_t*)t->presence_mask, 0, presence_mask_arr_size(t->array_size));
  // Clear the table part.
  size_t bytes = upb_table_size(&t->t) * sizeof(upb_tabent);
  t->t.count = 0;
  memset((char*)t->t.entries, 0, bytes);
}